

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O3

char * gdImageStringFTCircle
                 (gdImagePtr im,int cx,int cy,double radius,double textRadius,double fillPortion,
                 char *font,double points,char *top,char *bottom,int fgcolor)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  gdImagePtr dst;
  gdImagePtr pgVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  double dVar18;
  gdImagePtr local_d0;
  char *local_c0;
  int brect [8];
  
  dVar18 = points * 4.0;
  local_c0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar18,0.0,0,0,bottom);
  iVar12 = brect[7];
  iVar4 = brect[5];
  iVar15 = brect[3];
  iVar7 = brect[1];
  if (local_c0 == (char *)0x0) {
    iVar10 = brect[6];
    if (brect[6] < brect[4]) {
      iVar10 = brect[4];
    }
    iVar8 = brect[6];
    if (brect[4] < brect[6]) {
      iVar8 = brect[4];
    }
    iVar16 = brect[2];
    if (brect[2] < brect[0]) {
      iVar16 = brect[0];
    }
    iVar1 = brect[2];
    if (brect[0] < brect[2]) {
      iVar1 = brect[0];
    }
    if (iVar16 <= iVar10) {
      iVar16 = iVar10;
    }
    if (iVar8 <= iVar1) {
      iVar1 = iVar8;
    }
    local_c0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar18,0.0,0,0,top);
    if (local_c0 == (char *)0x0) {
      uVar9 = iVar16 - iVar1;
      iVar10 = iVar12;
      if (iVar12 < iVar4) {
        iVar10 = iVar4;
      }
      if (iVar4 < iVar12) {
        iVar12 = iVar4;
      }
      iVar4 = iVar15;
      if (iVar15 < iVar7) {
        iVar4 = iVar7;
      }
      if (iVar7 < iVar15) {
        iVar15 = iVar7;
      }
      if (iVar4 <= iVar10) {
        iVar4 = iVar10;
      }
      if (iVar12 <= iVar15) {
        iVar15 = iVar12;
      }
      iVar12 = brect[6];
      if (brect[6] < brect[4]) {
        iVar12 = brect[4];
      }
      if (brect[4] < brect[6]) {
        brect[6] = brect[4];
      }
      iVar7 = brect[2];
      if (brect[2] < brect[0]) {
        iVar7 = brect[0];
      }
      if (brect[0] < brect[2]) {
        brect[2] = brect[0];
      }
      if (iVar7 <= iVar12) {
        iVar7 = iVar12;
      }
      if (brect[6] <= brect[2]) {
        brect[2] = brect[6];
      }
      uVar17 = iVar7 - brect[2];
      iVar12 = brect[7];
      if (brect[7] < brect[5]) {
        iVar12 = brect[5];
      }
      if (brect[5] < brect[7]) {
        brect[7] = brect[5];
      }
      iVar7 = brect[3];
      if (brect[3] < brect[1]) {
        iVar7 = brect[1];
      }
      if (brect[1] < brect[3]) {
        brect[3] = brect[1];
      }
      if (iVar7 <= iVar12) {
        iVar7 = iVar12;
      }
      if (brect[7] <= brect[3]) {
        brect[3] = brect[7];
      }
      iVar12 = uVar17 + 6;
      if ((int)uVar17 < (int)uVar9) {
        iVar12 = uVar9 + 6;
      }
      iVar10 = iVar12 * 2 + 4;
      uVar6 = iVar7 - brect[3];
      if (iVar7 - brect[3] < iVar4 - iVar15) {
        uVar6 = iVar4 - iVar15;
      }
      iVar15 = uVar6 + 6;
      local_d0 = gdImageCreateTrueColor(iVar10,iVar15);
      if (local_d0 == (gdImagePtr)0x0) {
        local_c0 = "could not create first image";
      }
      else {
        iVar7 = iVar10 >> 1;
        local_c0 = gdImageStringFT(local_d0,(int *)0x0,0xffffff,font,dVar18,0.0,
                                   (int)(iVar7 - (uVar9 + 6)) / 2,(int)dVar18,bottom);
        if ((local_c0 == (char *)0x0) &&
           (local_c0 = gdImageStringFT(local_d0,(int *)0x0,0xffffff,font,dVar18,0.0,
                                       (int)(iVar7 - (uVar17 + 6)) / 2 + iVar7,(int)dVar18,top),
           local_c0 == (char *)0x0)) {
          iVar4 = iVar12 * 2;
          if ((uVar6 & 1) == 0) {
            if (0 < iVar15 >> 1) {
              if ((int)uVar9 < (int)uVar17) {
                uVar9 = uVar17;
              }
              uVar11 = 0;
              do {
                if (iVar7 < iVar4) {
                  piVar2 = local_d0->tpixels[(int)(~(uint)uVar11 + iVar15)];
                  piVar3 = local_d0->tpixels[uVar11];
                  lVar13 = ((long)((ulong)(uVar9 + 8) << 0x21) >> 0x21) + 1;
                  iVar12 = ((iVar7 + uVar9 * 2) - ((int)(uVar9 * 2 + 0x10) >> 1)) + 0xe;
                  do {
                    iVar8 = piVar2[(long)iVar12 + -1];
                    piVar2[(long)iVar12 + -1] = piVar3[lVar13 + 1];
                    piVar3[lVar13 + 1] = iVar8;
                    lVar13 = lVar13 + 1;
                    iVar12 = iVar12 + -1;
                  } while (lVar13 <= iVar4);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 != (uint)(iVar15 >> 1));
            }
          }
          else if (-8 < (int)uVar6) {
            iVar12 = iVar12 * 2 + 7;
            if (-1 < iVar10) {
              iVar12 = iVar10;
            }
            if ((int)uVar9 < (int)uVar17) {
              uVar9 = uVar17;
            }
            uVar11 = 0;
            do {
              iVar8 = 0;
              if (uVar11 == (uint)(iVar15 / 2)) {
                iVar8 = -(iVar12 >> 2);
              }
              iVar8 = iVar8 + iVar4 + 2;
              if (iVar7 + 2 < iVar8) {
                piVar2 = local_d0->tpixels[(int)(~(uint)uVar11 + iVar15)];
                piVar3 = local_d0->tpixels[uVar11];
                lVar13 = ((long)(((ulong)uVar9 << 0x21) + 0x1000000000) >> 0x21) + 2;
                iVar16 = ((iVar7 + uVar9 * 2) - ((int)(uVar9 * 2 + 0x10) >> 1)) + 0xe;
                do {
                  iVar1 = piVar2[(long)iVar16 + -1];
                  piVar2[(long)iVar16 + -1] = piVar3[lVar13];
                  piVar3[lVar13] = iVar1;
                  lVar13 = lVar13 + 1;
                  iVar16 = iVar16 + -1;
                } while (lVar13 < iVar8);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != iVar15 / 2 + 1);
          }
          iVar15 = iVar15 * 10;
          if (iVar10 <= iVar15) {
            iVar10 = iVar15;
          }
          dst = gdImageCreateTrueColor(iVar10,iVar10);
          if (dst == (gdImagePtr)0x0) {
            local_c0 = "could not create resampled image";
          }
          else {
            iVar12 = (int)((1.0 - textRadius / radius) * (double)iVar15);
            iVar7 = (int)((textRadius / radius) * (double)iVar15);
            gdImageCopyResampled
                      (dst,local_d0,(int)((1.0 - fillPortion) * (double)dst->sx * 0.25),iVar12,0,0,
                       (int)((double)dst->sx * fillPortion * 0.5),iVar7,local_d0->sx / 2,
                       local_d0->sy);
            dVar18 = (double)dst->sx;
            iVar15 = local_d0->sx / 2;
            gdImageCopyResampled
                      (dst,local_d0,
                       (int)((1.0 - fillPortion) * dVar18 * 0.25 + (double)(dst->sx / 2)),iVar12,
                       iVar15,0,(int)(dVar18 * fillPortion * 0.5),iVar7,iVar15,local_d0->sy);
            pgVar5 = gdImageSquareToCircle(dst,(int)radius);
            gdImageDestroy(local_d0);
            gdImageDestroy(dst);
            uVar9 = pgVar5->sy;
            if (0 < (int)uVar9) {
              uVar6 = uVar9 >> 1;
              uVar17 = pgVar5->sx;
              uVar11 = (ulong)uVar17;
              lVar13 = 0;
              do {
                if (0 < (int)uVar11) {
                  lVar14 = 0;
                  do {
                    gdImageSetPixel(im,(cx - (int)uVar17 / 2) + (int)lVar14,
                                    (cy - uVar6) + (int)lVar13,
                                    (fgcolor & 0xffffffU | 0x7f000000) +
                                    ((((uint)pgVar5->tpixels[lVar13][lVar14] >> 0x11 & 0x7f) *
                                     ((uint)~fgcolor >> 0x18 & 0x7f)) / 0x7f) * -0x1000000);
                    lVar14 = lVar14 + 1;
                    uVar11 = (ulong)pgVar5->sx;
                  } while (lVar14 < (long)uVar11);
                  uVar9 = pgVar5->sy;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < (int)uVar9);
            }
            local_c0 = (char *)0x0;
            local_d0 = pgVar5;
          }
        }
        gdImageDestroy(local_d0);
      }
    }
  }
  return local_c0;
}

Assistant:

BGD_DECLARE(char *)
gdImageStringFTCircle (gdImagePtr im,
                       int cx,
                       int cy,
                       double radius,
                       double textRadius,
                       double fillPortion,
                       char *font,
                       double points, char *top, char *bottom, int fgcolor)
{
	char *err;
	int w;
	int brect[8];
	int sx1, sx2, sy1, sy2, sx, sy;
	int x, y;
	int fr, fg, fb, fa;
	int ox, oy;
	double prop;
	gdImagePtr im1;
	gdImagePtr im2;
	gdImagePtr im3;
	/* obtain brect so that we can size the image */
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, bottom);
	if (err) {
		return err;
	}
	sx1 = MAXX (brect) - MINX (brect) + 6;
	sy1 = MAXY (brect) - MINY (brect) + 6;
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, top);
	if (err) {
		return err;
	}
	sx2 = MAXX (brect) - MINX (brect) + 6;
	sy2 = MAXY (brect) - MINY (brect) + 6;
	/* Pad by 4 pixels to allow for slight errors
	   observed in the bounding box returned by freetype */
	if (sx1 > sx2) {
		sx = sx1 * 2 + 4;
	} else {
		sx = sx2 * 2 + 4;
	}
	if (sy1 > sy2) {
		sy = sy1;
	} else {
		sy = sy2;
	}
	im1 = gdImageCreateTrueColor (sx, sy);
	if (!im1) {
		return "could not create first image";
	}
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, ((sx / 2) - sx1) / 2, points * MAG, bottom);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* We don't know the descent, which would be needed to do this
	   with the angle parameter. Instead, implement a simple
	   flip operation ourselves. */
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, sx / 2 + ((sx / 2) - sx2) / 2, points * MAG, top);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* Flip in place is tricky, be careful not to double-swap things */
	if (sy & 1) {
		for (y = 0; (y <= (sy / 2)); y++) {
			int xlimit = sx - 2;
			if (y == (sy / 2)) {
				/* If there is a "middle" row, be careful
				   not to swap twice! */
				xlimit -= (sx / 4);
			}
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	} else {
		for (y = 0; (y < (sy / 2)); y++) {
			int xlimit = sx - 2;
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	}
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx1.png", "wb");
		gdImagePng (im1, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Resample taller; the exact proportions of the text depend on the
	   ratio of textRadius to radius, and the value of fillPortion */
	if (sx > sy * 10) {
		w = sx;
	} else {
		w = sy * 10;
	}
	im2 = gdImageCreateTrueColor (w, w);
	if (!im2) {
		gdImageDestroy (im1);
		return "could not create resampled image";
	}
	prop = textRadius / radius;
	gdImageCopyResampled (im2, im1,
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      0, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
	gdImageCopyResampled (im2, im1,
	                      (gdImageSX (im2) / 2) +
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      gdImageSX (im1) / 2, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx2.png", "wb");
		gdImagePng (im2, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Ready to produce a circle */
	im3 = gdImageSquareToCircle (im2, radius);
	gdImageDestroy (im1);
	gdImageDestroy (im2);
	/* Now blend im3 with the destination. Cheat a little. The
	   source (im3) is white-on-black, so we can use the
	   red component as a basis for alpha as long as we're
	   careful to shift off the extra bit and invert
	   (alpha ranges from 0 to 127 where 0 is OPAQUE).
	   Also be careful to allow for an alpha component
	   in the fgcolor parameter itself (gug!) */
	fr = gdTrueColorGetRed (fgcolor);
	fg = gdTrueColorGetGreen (fgcolor);
	fb = gdTrueColorGetBlue (fgcolor);
	fa = gdTrueColorGetAlpha (fgcolor);
	ox = cx - (im3->sx / 2);
	oy = cy - (im3->sy / 2);
	for (y = 0; (y < im3->sy); y++) {
		for (x = 0; (x < im3->sx); x++) {
			int a = gdTrueColorGetRed (im3->tpixels[y][x]) >> 1;
			a *= (127 - fa);
			a /= 127;
			a = 127 - a;
			gdImageSetPixel (im, x + ox, y + oy,
			                 gdTrueColorAlpha (fr, fg, fb, a));
		}
	}
	gdImageDestroy (im3);
	return 0;
}